

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void upb_MtDecoder_ValidateEntryField(upb_MtDecoder *d,upb_MiniTableField *f,uint32_t expected_num)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  
  pcVar3 = "val";
  if (expected_num == 1) {
    pcVar3 = "key";
  }
  if (f->number_dont_copy_me__upb_internal_use_only != expected_num) {
    upb_MdDecoder_ErrorJmp(&d->base,"map %s did not have expected number (%d vs %d)",pcVar3);
  }
  if ((f->mode_dont_copy_me__upb_internal_use_only & 3) != 2) {
    upb_MdDecoder_ErrorJmp(&d->base,"map %s cannot be repeated or map, or be in oneof",pcVar3);
  }
  uVar2 = 0x400;
  if (expected_num == 1) {
    uVar2 = 0x5c06;
  }
  bVar1 = f->descriptortype_dont_copy_me__upb_internal_use_only;
  if ((f->mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
    uVar4 = (uint)bVar1;
  }
  else if (bVar1 == 5) {
    uVar4 = 0xe;
  }
  else {
    if (bVar1 != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                    ,0x7b,"upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)"
                   );
    }
    uVar4 = 9;
  }
  if ((uVar2 >> (uVar4 & 0x1f) & 1) != 0) {
    upb_MdDecoder_ErrorJmp(&d->base,"map %s cannot have type %d",pcVar3);
  }
  return;
}

Assistant:

static void upb_MtDecoder_ValidateEntryField(upb_MtDecoder* d,
                                             const upb_MiniTableField* f,
                                             uint32_t expected_num) {
  const char* name = expected_num == 1 ? "key" : "val";
  const uint32_t f_number = upb_MiniTableField_Number(f);
  if (f_number != expected_num) {
    upb_MdDecoder_ErrorJmp(&d->base,
                           "map %s did not have expected number (%d vs %d)",
                           name, expected_num, f_number);
  }

  if (!upb_MiniTableField_IsScalar(f)) {
    upb_MdDecoder_ErrorJmp(
        &d->base, "map %s cannot be repeated or map, or be in oneof", name);
  }

  uint32_t not_ok_types;
  if (expected_num == 1) {
    not_ok_types = (1 << kUpb_FieldType_Float) | (1 << kUpb_FieldType_Double) |
                   (1 << kUpb_FieldType_Message) | (1 << kUpb_FieldType_Group) |
                   (1 << kUpb_FieldType_Bytes) | (1 << kUpb_FieldType_Enum);
  } else {
    not_ok_types = 1 << kUpb_FieldType_Group;
  }

  if ((1 << upb_MiniTableField_Type(f)) & not_ok_types) {
    upb_MdDecoder_ErrorJmp(&d->base, "map %s cannot have type %d", name,
                           (int)f->UPB_PRIVATE(descriptortype));
  }
}